

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpivotL.c
# Opt level: O2

int zpivotL(int jcol,double u,int *usepr,int *perm_r,int *iperm_r,int *iperm_c,int *pivrow,
           GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int_t iVar4;
  flops_t *pfVar5;
  void *pvVar6;
  int_t *piVar7;
  double dVar8;
  undefined8 uVar9;
  int iVar10;
  long lVar11;
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  doublecomplex *z;
  int iVar21;
  int iVar22;
  long lVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  doublecomplex temp;
  doublecomplex one;
  
  one.r = 1.0;
  one.i = 0.0;
  pfVar5 = stat->ops;
  pvVar6 = Glu->lusup;
  iVar3 = Glu->xsup[Glu->supno[jcol]];
  iVar15 = Glu->xlsub[iVar3];
  iVar18 = Glu->xlsub[(long)iVar3 + 1] - iVar15;
  lVar23 = (long)Glu->xlusup[jcol] * 0x10;
  piVar7 = Glu->lsub;
  iVar21 = jcol - iVar3;
  iVar3 = Glu->xlusup[iVar3];
  if (*usepr != 0) {
    *pivrow = iperm_r[jcol];
  }
  iVar10 = iperm_c[jcol];
  uVar19 = (ulong)iVar21;
  lVar11 = uVar19 * 0x10;
  z = (doublecomplex *)((long)pvVar6 + lVar11 + lVar23);
  uVar16 = 0xffffffffffffffff;
  dVar26 = 0.0;
  iVar22 = iVar21;
  iVar17 = iVar21;
  for (uVar20 = uVar19; (long)uVar20 < (long)iVar18; uVar20 = uVar20 + 1) {
    dVar8 = z_abs1(z);
    uVar24 = SUB84(dVar8,0);
    uVar25 = (undefined4)((ulong)dVar8 >> 0x20);
    if (dVar26 < dVar8) {
      iVar22 = (int)uVar20;
    }
    if ((*usepr != 0) && (piVar7[(long)iVar15 + uVar20] == *pivrow)) {
      iVar17 = (int)uVar20;
    }
    if (piVar7[(long)iVar15 + uVar20] == iVar10) {
      uVar16 = uVar20;
    }
    uVar16 = uVar16 & 0xffffffff;
    if (dVar8 <= dVar26) {
      uVar24 = SUB84(dVar26,0);
      uVar25 = (undefined4)((ulong)dVar26 >> 0x20);
    }
    z = z + 1;
    dVar26 = (double)CONCAT44(uVar25,uVar24);
  }
  if ((dVar26 == 0.0) && (!NAN(dVar26))) {
    *usepr = 0;
    return jcol + 1;
  }
  if (*usepr != 0) {
    dVar8 = z_abs1((doublecomplex *)((long)pvVar6 + (long)iVar17 * 0x10 + lVar23));
    if (((dVar8 == 0.0) && (!NAN(dVar8))) || (dVar8 < dVar26 * u)) {
      *usepr = 0;
    }
    else {
      iVar22 = iVar17;
      if (*usepr != 0) {
        iVar10 = *pivrow;
        goto LAB_00109b58;
      }
    }
  }
  iVar17 = iVar22;
  if ((-1 < (int)uVar16) &&
     (dVar8 = z_abs1((doublecomplex *)((long)pvVar6 + (uVar16 & 0xffffffff) * 0x10 + lVar23)),
     dVar8 != 0.0 && dVar26 * u <= dVar8)) {
    iVar17 = (int)uVar16;
  }
  iVar10 = piVar7[(long)iVar15 + (long)iVar17];
  *pivrow = iVar10;
LAB_00109b58:
  perm_r[iVar10] = jcol;
  if (iVar17 != iVar21) {
    iVar4 = piVar7[(long)iVar15 + (long)iVar17];
    piVar7[(long)iVar15 + (long)iVar17] = piVar7[(long)iVar15 + uVar19];
    piVar7[(long)iVar15 + uVar19] = iVar4;
    iVar15 = iVar21;
    for (lVar14 = 0; lVar14 <= (long)uVar19; lVar14 = lVar14 + 1) {
      pdVar13 = (double *)((long)pvVar6 + (long)iVar17 * 0x10 + (long)iVar3 * 0x10);
      temp.r = *pdVar13;
      temp.i = pdVar13[1];
      puVar1 = (undefined8 *)((long)pvVar6 + (long)iVar15 * 0x10 + (long)iVar3 * 0x10);
      uVar9 = puVar1[1];
      puVar2 = (undefined8 *)((long)pvVar6 + (long)iVar17 * 0x10 + (long)iVar3 * 0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar9;
      pdVar13 = (double *)((long)pvVar6 + (long)iVar15 * 0x10 + (long)iVar3 * 0x10);
      *pdVar13 = temp.r;
      pdVar13[1] = temp.i;
      iVar15 = iVar15 + iVar18;
      iVar17 = iVar17 + iVar18;
    }
  }
  pfVar5[7] = (float)((iVar18 - iVar21) * 10) + pfVar5[7];
  z_div(&temp,&one,(doublecomplex *)((long)pvVar6 + lVar11 + lVar23));
  pdVar13 = (double *)(lVar23 + lVar11 + (long)pvVar6);
  while( true ) {
    uVar19 = uVar19 + 1;
    pdVar12 = pdVar13 + 2;
    if ((long)iVar18 <= (long)uVar19) break;
    dVar26 = *pdVar12;
    *pdVar12 = temp.r * dVar26 + -pdVar13[3] * temp.i;
    pdVar13[3] = temp.r * pdVar13[3] + dVar26 * temp.i;
    pdVar13 = pdVar12;
  }
  return 0;
}

Assistant:

int
zpivotL(
        const int  jcol,     /* in */
        const double u,      /* in - diagonal pivoting threshold */
        int        *usepr,   /* re-use the pivot sequence given by perm_r/iperm_r */
        int        *perm_r,  /* may be modified */
        int        *iperm_r, /* in - inverse of perm_r */
        int        *iperm_c, /* in - used to find diagonal of Pc*A*Pc' */
        int        *pivrow,  /* out */
        GlobalLU_t *Glu,     /* modified - global LU data structures */
	SuperLUStat_t *stat  /* output */
       )
{

    doublecomplex one = {1.0, 0.0};
    int          fsupc;	    /* first column in the supernode */
    int          nsupc;	    /* no of columns in the supernode */
    int          nsupr;     /* no of rows in the supernode */
    int_t        lptr;	    /* points to the starting subscript of the supernode */
    int          pivptr, old_pivptr, diag, diagind;
    double       pivmax, rtemp, thresh;
    doublecomplex       temp;
    doublecomplex       *lu_sup_ptr; 
    doublecomplex       *lu_col_ptr;
    int_t        *lsub_ptr;
    int_t        isub, icol, k, itemp;
    int_t        *lsub, *xlsub;
    doublecomplex       *lusup;
    int_t        *xlusup;
    flops_t      *ops = stat->ops;

    /* Initialize pointers */
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (doublecomplex *) Glu->lusup;
    xlusup     = Glu->xlusup;
    fsupc      = (Glu->xsup)[(Glu->supno)[jcol]];
    nsupc      = jcol - fsupc;	        /* excluding jcol; nsupc >= 0 */
    lptr       = xlsub[fsupc];
    nsupr      = xlsub[fsupc+1] - lptr;
    lu_sup_ptr = &lusup[xlusup[fsupc]];	/* start of the current supernode */
    lu_col_ptr = &lusup[xlusup[jcol]];	/* start of jcol in the supernode */
    lsub_ptr   = &lsub[lptr];	/* start of row indices of the supernode */

#ifdef DEBUG
if ( jcol == MIN_COL ) {
    printf("Before cdiv: col %d\n", jcol);
    for (k = nsupc; k < nsupr; k++) 
	printf("  lu[%d] %f\n", lsub_ptr[k], lu_col_ptr[k]);
}
#endif
    
    /* Determine the largest abs numerical value for partial pivoting;
       Also search for user-specified pivot, and diagonal element. */
    if ( *usepr ) *pivrow = iperm_r[jcol];
    diagind = iperm_c[jcol];
    pivmax = 0.0;
    pivptr = nsupc;
    diag = SLU_EMPTY;
    old_pivptr = nsupc;
    for (isub = nsupc; isub < nsupr; ++isub) {
        rtemp = z_abs1 (&lu_col_ptr[isub]);
	if ( rtemp > pivmax ) {
	    pivmax = rtemp;
	    pivptr = isub;
	}
	if ( *usepr && lsub_ptr[isub] == *pivrow ) old_pivptr = isub;
	if ( lsub_ptr[isub] == diagind ) diag = isub;
    }

    /* Test for singularity */
    if ( pivmax == 0.0 ) {
#if 0
        // There is no valid pivot.
        // jcol represents the rank of U, 
        // report the rank, let dgstrf handle the pivot
	*pivrow = lsub_ptr[pivptr];
	perm_r[*pivrow] = jcol;
#endif
	*usepr = 0;
	return (jcol+1);
    }

    thresh = u * pivmax;
    
    /* Choose appropriate pivotal element by our policy. */
    if ( *usepr ) {
        rtemp = z_abs1 (&lu_col_ptr[old_pivptr]);
	if ( rtemp != 0.0 && rtemp >= thresh )
	    pivptr = old_pivptr;
	else
	    *usepr = 0;
    }
    if ( *usepr == 0 ) {
	/* Use diagonal pivot? */
	if ( diag >= 0 ) { /* diagonal exists */
            rtemp = z_abs1 (&lu_col_ptr[diag]);
	    if ( rtemp != 0.0 && rtemp >= thresh ) pivptr = diag;
        }
	*pivrow = lsub_ptr[pivptr];
    }
    
    /* Record pivot row */
    perm_r[*pivrow] = jcol;
    
    /* Interchange row subscripts */
    if ( pivptr != nsupc ) {
	itemp = lsub_ptr[pivptr];
	lsub_ptr[pivptr] = lsub_ptr[nsupc];
	lsub_ptr[nsupc] = itemp;

	/* Interchange numerical values as well, for the whole snode, such 
	 * that L is indexed the same way as A.
 	 */
	for (icol = 0; icol <= nsupc; icol++) {
	    itemp = pivptr + icol * nsupr;
	    temp = lu_sup_ptr[itemp];
	    lu_sup_ptr[itemp] = lu_sup_ptr[nsupc + icol*nsupr];
	    lu_sup_ptr[nsupc + icol*nsupr] = temp;
	}
    } /* if */

    /* cdiv operation */
    ops[FACT] += 10 * (nsupr - nsupc);

    z_div(&temp, &one, &lu_col_ptr[nsupc]);
    for (k = nsupc+1; k < nsupr; k++) 
	zz_mult(&lu_col_ptr[k], &lu_col_ptr[k], &temp);

    return 0;
}